

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O2

QString * __thiscall
Driver::findOrInsert<DomWidget>
          (QString *__return_storage_ptr__,Driver *this,DomObjectHash<DomWidget> *domHash,
          DomWidget *dom,QString *className,bool isMember)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QStringBuilder<QString_&,_const_QString_&> local_80;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  DomWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = dom;
  pVar3 = (piter)QHash<DomWidget_const*,QString>::findImpl<DomWidget_const*>
                           ((QHash<DomWidget_const*,QString> *)domHash,&local_40);
  if (pVar3.d == (Data<QHashPrivate::Node<const_DomWidget_*,_QString>_> *)0x0 && pVar3.bucket == 0)
  {
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_70.d = (local_40->m_attr_name).d.d;
    local_70.ptr = (local_40->m_attr_name).d.ptr;
    local_70.size = (local_40->m_attr_name).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    unique((QString *)&local_58,this,(QString *)&local_70,className);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    if (isMember) {
      local_80.a = (QString *)language::self;
      local_80.b = (QString *)&local_58;
      QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>((QString *)&local_70,&local_80)
      ;
    }
    else {
      local_70.d = local_58.d;
      local_70.ptr = local_58.ptr;
      local_70.size = local_58.size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    pVar3 = (piter)QHash<DomWidget_const*,QString>::emplace<QString_const&>
                             ((QHash<DomWidget_const*,QString> *)domHash,&local_40,
                              (QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  pSVar1 = (pVar3.d)->spans;
  uVar2 = pVar3.bucket >> 7;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&__return_storage_ptr__->d,
             (QArrayDataPointer<char16_t> *)
             (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)pVar3.bucket & 0x7f]].storage.data +
             8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString Driver::findOrInsert(DomObjectHash<DomClass> *domHash, const DomClass *dom,
                             const QString &className, bool isMember)
{
    auto it = domHash->find(dom);
    if (it == domHash->end()) {
        const QString name = this->unique(dom->attributeName(), className);
        it = domHash->insert(dom, isMember ? language::self + name : name);
    }
    return it.value();
}